

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

CURLcode verifyhost(connectdata *conn,X509 *server_cert)

{
  Curl_easy *data_00;
  bool bVar1;
  int iVar2;
  OPENSSL_STACK *pOVar3;
  Curl_easy *__n;
  Curl_easy *pCVar4;
  X509_NAME *name_00;
  X509_NAME_ENTRY *ne;
  ASN1_STRING *x;
  X509_NAME *__dest;
  void *__src;
  size_t uznum;
  byte local_d1;
  char *local_d0;
  char *local_c8;
  CURLcode rc;
  ASN1_STRING *tmp;
  X509_NAME *name;
  uchar *peer_CN;
  uchar *nulstr;
  int i_1;
  int j;
  size_t altlen;
  char *altptr;
  GENERAL_NAME *check;
  int local_70;
  _Bool ipmatched;
  int iStack_6c;
  _Bool dnsmatched;
  int i;
  int numalts;
  char *dispname;
  char *hostname;
  undefined1 local_50 [2];
  _Bool iPAddress;
  _Bool dNSName;
  CURLcode result;
  in6_addr addr;
  stack_st_GENERAL_NAME *altnames;
  Curl_easy *data;
  size_t addrlen;
  int target;
  _Bool matched;
  X509 *server_cert_local;
  connectdata *conn_local;
  
  bVar1 = false;
  addrlen._0_4_ = 2;
  data = (Curl_easy *)0x0;
  data_00 = conn->data;
  hostname._4_4_ = CURLE_OK;
  hostname._3_1_ = 0;
  hostname._2_1_ = 0;
  if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
     (conn->proxy_ssl[(int)(uint)(conn->sock[1] != -1)].state != ssl_connection_complete)) {
    local_c8 = (conn->http_proxy).host.name;
  }
  else {
    local_c8 = (conn->host).name;
  }
  dispname = local_c8;
  if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
     (conn->proxy_ssl[(int)(uint)(conn->sock[1] != -1)].state != ssl_connection_complete)) {
    local_d0 = (conn->http_proxy).host.dispname;
  }
  else {
    local_d0 = (conn->host).dispname;
  }
  _i = local_d0;
  if ((((conn->bits).ipv6_ip & 1U) == 0) || (iVar2 = inet_pton(10,local_c8,local_50), iVar2 == 0)) {
    iVar2 = inet_pton(2,dispname,local_50);
    if (iVar2 != 0) {
      addrlen._0_4_ = 7;
      data = (Curl_easy *)0x4;
    }
  }
  else {
    addrlen._0_4_ = 7;
    data = (Curl_easy *)0x10;
  }
  addr.__in6_u._8_8_ = X509_get_ext_d2i((X509 *)server_cert,0x55,(int *)0x0,(int *)0x0);
  if ((stack_st_GENERAL_NAME *)addr.__in6_u._8_8_ != (stack_st_GENERAL_NAME *)0x0) {
    check._7_1_ = 0;
    check._6_1_ = 0;
    pOVar3 = ossl_check_const_GENERAL_NAME_sk_type((stack_st_GENERAL_NAME *)addr.__in6_u._8_8_);
    iStack_6c = OPENSSL_sk_num(pOVar3);
    local_70 = 0;
    while( true ) {
      local_d1 = 0;
      if (local_70 < iStack_6c) {
        local_d1 = check._7_1_ ^ 0xff;
      }
      if ((local_d1 & 1) == 0) break;
      pOVar3 = ossl_check_const_GENERAL_NAME_sk_type((stack_st_GENERAL_NAME *)addr.__in6_u._8_8_);
      altptr = (char *)OPENSSL_sk_value(pOVar3,local_70);
      if (*(int *)altptr == 2) {
        hostname._3_1_ = 1;
      }
      else if (*(int *)altptr == 7) {
        hostname._2_1_ = 1;
      }
      if (*(int *)altptr == (int)addrlen) {
        altlen = ASN1_STRING_get0_data(*(undefined8 *)((long)altptr + 8));
        iVar2 = ASN1_STRING_length(*(ASN1_STRING **)(altptr + 8));
        __n = (Curl_easy *)(long)iVar2;
        _i_1 = __n;
        if ((int)addrlen == 2) {
          pCVar4 = (Curl_easy *)strlen((char *)altlen);
          if ((__n == pCVar4) && (iVar2 = Curl_cert_hostcheck((char *)altlen,dispname), iVar2 != 0))
          {
            check._7_1_ = 1;
            Curl_infof(data_00," subjectAltName: host \"%s\" matched cert\'s \"%s\"\n",_i,altlen);
          }
        }
        else if ((((int)addrlen == 7) && (__n == data)) &&
                (iVar2 = memcmp((void *)altlen,local_50,(size_t)__n), iVar2 == 0)) {
          check._6_1_ = 1;
          Curl_infof(data_00," subjectAltName: host \"%s\" matched cert\'s IP address!\n",_i);
        }
      }
      local_70 = local_70 + 1;
    }
    GENERAL_NAMES_free((GENERAL_NAMES *)addr.__in6_u._8_8_);
    if (((check._7_1_ & 1) != 0) || ((check._6_1_ & 1) != 0)) {
      bVar1 = true;
    }
  }
  if (!bVar1) {
    if (((hostname._3_1_ & 1) == 0) && ((hostname._2_1_ & 1) == 0)) {
      nulstr._0_4_ = -1;
      peer_CN = "";
      name = (X509_NAME *)0x1834ac;
      name_00 = X509_get_subject_name((X509 *)server_cert);
      iVar2 = (int)nulstr;
      if (name_00 != (X509_NAME *)0x0) {
        do {
          nulstr._0_4_ = iVar2;
          nulstr._4_4_ = X509_NAME_get_index_by_NID(name_00,0xd,(int)nulstr);
          iVar2 = nulstr._4_4_;
        } while (-1 < nulstr._4_4_);
      }
      if (-1 < (int)nulstr) {
        ne = X509_NAME_get_entry(name_00,(int)nulstr);
        x = X509_NAME_ENTRY_get_data(ne);
        if (x != (ASN1_STRING *)0x0) {
          iVar2 = ASN1_STRING_type(x);
          if (iVar2 == 0xc) {
            nulstr._4_4_ = ASN1_STRING_length(x);
            if ((-1 < nulstr._4_4_) &&
               (__dest = (X509_NAME *)
                         CRYPTO_malloc(nulstr._4_4_ + 1,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/lib/vtls/openssl.c"
                                       ,0x5c9), name = __dest, __dest != (X509_NAME *)0x0)) {
              __src = (void *)ASN1_STRING_get0_data(x);
              memcpy(__dest,__src,(long)nulstr._4_4_);
              name[nulstr._4_4_] = (X509_NAME)0x0;
            }
          }
          else {
            nulstr._4_4_ = ASN1_STRING_to_UTF8((uchar **)&name,x);
          }
          if (name != (X509_NAME *)0x0) {
            uznum = strlen((char *)name);
            iVar2 = curlx_uztosi(uznum);
            if (iVar2 != nulstr._4_4_) {
              Curl_failf(data_00,"SSL: illegal cert name field");
              hostname._4_4_ = CURLE_PEER_FAILED_VERIFICATION;
            }
          }
        }
      }
      if (name == (X509_NAME *)peer_CN) {
        name = (X509_NAME *)0x0;
      }
      if (hostname._4_4_ == CURLE_OK) {
        if (name == (X509_NAME *)0x0) {
          Curl_failf(data_00,"SSL: unable to obtain common name from peer certificate");
          hostname._4_4_ = CURLE_PEER_FAILED_VERIFICATION;
        }
        else {
          iVar2 = Curl_cert_hostcheck((char *)name,dispname);
          if (iVar2 == 0) {
            Curl_failf(data_00,
                       "SSL: certificate subject name \'%s\' does not match target host name \'%s\'"
                       ,name,_i);
            hostname._4_4_ = CURLE_PEER_FAILED_VERIFICATION;
          }
          else {
            Curl_infof(data_00," common name: %s (matched)\n",name);
          }
        }
      }
      if (name != (X509_NAME *)0x0) {
        CRYPTO_free(name);
      }
    }
    else {
      Curl_infof(data_00," subjectAltName does not match %s\n",_i);
      Curl_failf(data_00,
                 "SSL: no alternative certificate subject name matches target host name \'%s\'",_i);
      hostname._4_4_ = CURLE_PEER_FAILED_VERIFICATION;
    }
  }
  return hostname._4_4_;
}

Assistant:

static CURLcode verifyhost(struct connectdata *conn, X509 *server_cert)
{
  bool matched = FALSE;
  int target = GEN_DNS; /* target type, GEN_DNS or GEN_IPADD */
  size_t addrlen = 0;
  struct Curl_easy *data = conn->data;
  STACK_OF(GENERAL_NAME) *altnames;
#ifdef ENABLE_IPV6
  struct in6_addr addr;
#else
  struct in_addr addr;
#endif
  CURLcode result = CURLE_OK;
  bool dNSName = FALSE; /* if a dNSName field exists in the cert */
  bool iPAddress = FALSE; /* if a iPAddress field exists in the cert */
  const char * const hostname = SSL_IS_PROXY() ? conn->http_proxy.host.name :
    conn->host.name;
  const char * const dispname = SSL_IS_PROXY() ?
    conn->http_proxy.host.dispname : conn->host.dispname;

#ifdef ENABLE_IPV6
  if(conn->bits.ipv6_ip &&
     Curl_inet_pton(AF_INET6, hostname, &addr)) {
    target = GEN_IPADD;
    addrlen = sizeof(struct in6_addr);
  }
  else
#endif
    if(Curl_inet_pton(AF_INET, hostname, &addr)) {
      target = GEN_IPADD;
      addrlen = sizeof(struct in_addr);
    }

  /* get a "list" of alternative names */
  altnames = X509_get_ext_d2i(server_cert, NID_subject_alt_name, NULL, NULL);

  if(altnames) {
    int numalts;
    int i;
    bool dnsmatched = FALSE;
    bool ipmatched = FALSE;

    /* get amount of alternatives, RFC2459 claims there MUST be at least
       one, but we don't depend on it... */
    numalts = sk_GENERAL_NAME_num(altnames);

    /* loop through all alternatives - until a dnsmatch */
    for(i = 0; (i < numalts) && !dnsmatched; i++) {
      /* get a handle to alternative name number i */
      const GENERAL_NAME *check = sk_GENERAL_NAME_value(altnames, i);

      if(check->type == GEN_DNS)
        dNSName = TRUE;
      else if(check->type == GEN_IPADD)
        iPAddress = TRUE;

      /* only check alternatives of the same type the target is */
      if(check->type == target) {
        /* get data and length */
        const char *altptr = (char *)ASN1_STRING_get0_data(check->d.ia5);
        size_t altlen = (size_t) ASN1_STRING_length(check->d.ia5);

        switch(target) {
        case GEN_DNS: /* name/pattern comparison */
          /* The OpenSSL man page explicitly says: "In general it cannot be
             assumed that the data returned by ASN1_STRING_data() is null
             terminated or does not contain embedded nulls." But also that
             "The actual format of the data will depend on the actual string
             type itself: for example for and IA5String the data will be ASCII"

             Gisle researched the OpenSSL sources:
             "I checked the 0.9.6 and 0.9.8 sources before my patch and
             it always 0-terminates an IA5String."
          */
          if((altlen == strlen(altptr)) &&
             /* if this isn't true, there was an embedded zero in the name
                string and we cannot match it. */
             Curl_cert_hostcheck(altptr, hostname)) {
            dnsmatched = TRUE;
            infof(data,
                  " subjectAltName: host \"%s\" matched cert's \"%s\"\n",
                  dispname, altptr);
          }
          break;

        case GEN_IPADD: /* IP address comparison */
          /* compare alternative IP address if the data chunk is the same size
             our server IP address is */
          if((altlen == addrlen) && !memcmp(altptr, &addr, altlen)) {
            ipmatched = TRUE;
            infof(data,
                  " subjectAltName: host \"%s\" matched cert's IP address!\n",
                  dispname);
          }
          break;
        }
      }
    }
    GENERAL_NAMES_free(altnames);

    if(dnsmatched || ipmatched)
      matched = TRUE;
  }

  if(matched)
    /* an alternative name matched */
    ;
  else if(dNSName || iPAddress) {
    infof(data, " subjectAltName does not match %s\n", dispname);
    failf(data, "SSL: no alternative certificate subject name matches "
          "target host name '%s'", dispname);
    result = CURLE_PEER_FAILED_VERIFICATION;
  }
  else {
    /* we have to look to the last occurrence of a commonName in the
       distinguished one to get the most significant one. */
    int j, i = -1;

    /* The following is done because of a bug in 0.9.6b */

    unsigned char *nulstr = (unsigned char *)"";
    unsigned char *peer_CN = nulstr;

    X509_NAME *name = X509_get_subject_name(server_cert);
    if(name)
      while((j = X509_NAME_get_index_by_NID(name, NID_commonName, i)) >= 0)
        i = j;

    /* we have the name entry and we will now convert this to a string
       that we can use for comparison. Doing this we support BMPstring,
       UTF8 etc. */

    if(i >= 0) {
      ASN1_STRING *tmp =
        X509_NAME_ENTRY_get_data(X509_NAME_get_entry(name, i));

      /* In OpenSSL 0.9.7d and earlier, ASN1_STRING_to_UTF8 fails if the input
         is already UTF-8 encoded. We check for this case and copy the raw
         string manually to avoid the problem. This code can be made
         conditional in the future when OpenSSL has been fixed. Work-around
         brought by Alexis S. L. Carvalho. */
      if(tmp) {
        if(ASN1_STRING_type(tmp) == V_ASN1_UTF8STRING) {
          j = ASN1_STRING_length(tmp);
          if(j >= 0) {
            peer_CN = OPENSSL_malloc(j + 1);
            if(peer_CN) {
              memcpy(peer_CN, ASN1_STRING_get0_data(tmp), j);
              peer_CN[j] = '\0';
            }
          }
        }
        else /* not a UTF8 name */
          j = ASN1_STRING_to_UTF8(&peer_CN, tmp);

        if(peer_CN && (curlx_uztosi(strlen((char *)peer_CN)) != j)) {
          /* there was a terminating zero before the end of string, this
             cannot match and we return failure! */
          failf(data, "SSL: illegal cert name field");
          result = CURLE_PEER_FAILED_VERIFICATION;
        }
      }
    }

    if(peer_CN == nulstr)
       peer_CN = NULL;
    else {
      /* convert peer_CN from UTF8 */
      CURLcode rc = Curl_convert_from_utf8(data, (char *)peer_CN,
                                           strlen((char *)peer_CN));
      /* Curl_convert_from_utf8 calls failf if unsuccessful */
      if(rc) {
        OPENSSL_free(peer_CN);
        return rc;
      }
    }

    if(result)
      /* error already detected, pass through */
      ;
    else if(!peer_CN) {
      failf(data,
            "SSL: unable to obtain common name from peer certificate");
      result = CURLE_PEER_FAILED_VERIFICATION;
    }
    else if(!Curl_cert_hostcheck((const char *)peer_CN, hostname)) {
      failf(data, "SSL: certificate subject name '%s' does not match "
            "target host name '%s'", peer_CN, dispname);
      result = CURLE_PEER_FAILED_VERIFICATION;
    }
    else {
      infof(data, " common name: %s (matched)\n", peer_CN);
    }
    if(peer_CN)
      OPENSSL_free(peer_CN);
  }

  return result;
}